

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::kill_expr
          (compiler_type *this,deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens)

{
  _Elt_pointer pptVar1;
  _Map_pointer ppptVar2;
  _Map_pointer ppptVar3;
  _Elt_pointer pptVar4;
  int iVar5;
  token_base *ptVar6;
  undefined4 extraout_var;
  _Elt_pointer pptVar7;
  long lVar8;
  iterator *piVar9;
  iterator *piVar10;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *p_Var11;
  tree_type<cs::token_base_*> *size;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar12;
  deque<cs::token_base*,std::allocator<cs::token_base*>> *this_00;
  _Elt_pointer __args;
  _Elt_pointer pptVar13;
  _Map_pointer ppptVar14;
  byte bVar15;
  tree_type<cs::token_base_*> tree;
  tree_type<cs::token_base_*> local_138;
  size_t sStack_130;
  _Map_pointer local_120;
  iterator *local_118;
  _func_int **local_110;
  compiler_type *local_108;
  _Elt_pointer local_100;
  _Elt_pointer local_f8;
  token_base *local_f0;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_e8;
  _Elt_pointer local_98;
  _Elt_pointer pptStack_90;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_88;
  
  bVar15 = 0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_108 = this;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_88,0);
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_e8,0);
  local_138.mRoot =
       (tree_node *)
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_map;
  sStack_130 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_map_size;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
       (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  p_Var11 = &local_88;
  pdVar12 = tokens;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pdVar12->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
    super__Deque_impl_data._M_map = (p_Var11->_M_impl).super__Deque_impl_data._M_map;
    p_Var11 = (_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)p_Var11 + ((ulong)bVar15 * -2 + 1) * 8);
    pdVar12 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              ((long)pdVar12 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)local_138.mRoot;
  local_88._M_impl.super__Deque_impl_data._M_map_size = sStack_130;
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::clear(tokens);
  pptVar4 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    piVar10 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish;
    local_120 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
    local_110 = (_func_int **)&PTR__token_expr_00250058;
    __args = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar13 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
    local_118 = piVar10;
    do {
      iVar5 = (*(*__args)->_vptr_token_base[2])();
      if ((iVar5 == 2) || (iVar5 = (*(*__args)->_vptr_token_base[2])(), iVar5 == 1)) {
        piVar9 = piVar10;
        if (local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_e8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_138.mRoot = (tree_node *)0x0;
          size = &local_138;
          gen_tree(local_108,&local_138,
                   (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_e8);
          ptVar6 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)size);
          iVar5 = tree_type<cs::token_base_*>::copy
                            ((EVP_PKEY_CTX *)local_138.mRoot,(EVP_PKEY_CTX *)0x0);
          ptVar6->line_num = 1;
          ptVar6->_vptr_token_base = local_110;
          ptVar6[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar5);
          pptVar1 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_f0 = ptVar6;
          if (pptVar1 ==
              (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
            _M_push_back_aux<cs::token_base*>
                      ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,&local_f0);
          }
          else {
            *pptVar1 = ptVar6;
            piVar10->_M_cur = piVar10->_M_cur + 1;
          }
          local_f8 = pptVar13;
          tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
          ppptVar3 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppptVar2 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
          local_98 = local_e8._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptStack_90 = local_e8._M_impl.super__Deque_impl_data._M_start._M_first;
          local_100 = local_e8._M_impl.super__Deque_impl_data._M_start._M_last;
          for (ppptVar14 = local_e8._M_impl.super__Deque_impl_data._M_start._M_node;
              ppptVar14 < ppptVar3; ppptVar14 = ppptVar14 + 1) {
            operator_delete(ppptVar14[1],0x200);
          }
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_node = ppptVar2;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_first = pptStack_90;
          local_e8._M_impl.super__Deque_impl_data._M_finish._M_last = local_100;
          tree_type<cs::token_base_*>::destroy(local_138.mRoot);
          piVar9 = local_118;
          pptVar13 = local_f8;
        }
        pptVar7 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_cur;
        piVar10 = piVar9;
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
        pptVar1 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      else {
        this_00 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_e8;
        piVar9 = &local_e8._M_impl.super__Deque_impl_data._M_finish;
        pptVar7 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar1 = local_e8._M_impl.super__Deque_impl_data._M_finish._M_last;
      }
      if (pptVar7 == pptVar1 + -1) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*const&>(this_00,__args);
      }
      else {
        *pptVar7 = *__args;
        piVar9->_M_cur = piVar9->_M_cur + 1;
      }
      __args = __args + 1;
      if (__args == pptVar13) {
        __args = local_120[1];
        local_120 = local_120 + 1;
        pptVar13 = __args + 0x40;
      }
    } while (__args != pptVar4);
  }
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_e8);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void compiler_type::kill_expr(std::deque<token_base *> &tokens)
	{
		std::deque<token_base *> oldt, expr;
		std::swap(tokens, oldt);
		tokens.clear();
		for (auto &ptr: oldt) {
			if (ptr->get_type() == token_types::action || ptr->get_type() == token_types::endline) {
				if (!expr.empty()) {
					tree_type<token_base *> tree;
					gen_tree(tree, expr);
					tokens.push_back(new token_expr(tree));
					expr.clear();
				}
				tokens.push_back(ptr);
			}
			else
				expr.push_back(ptr);
		}
	}